

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O1

s32 __thiscall
irr::core::array<irr::video::CNullDriver::SSurface>::binary_search
          (array<irr::video::CNullDriver::SSurface> *this,SSurface *element,s32 left,s32 right)

{
  pointer pSVar1;
  int iVar2;
  __normal_iterator<const_irr::video::CNullDriver::SSurface_*,_std::vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>_>
  _Var3;
  s32 sVar4;
  
  sVar4 = -1;
  if (left <= right) {
    pSVar1 = (this->m_data).
             super__Vector_base<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>
             ._M_impl.super__Vector_impl_data._M_start;
    _Var3 = ::std::
            __lower_bound<__gnu_cxx::__normal_iterator<irr::video::CNullDriver::SSurface_const*,std::vector<irr::video::CNullDriver::SSurface,std::allocator<irr::video::CNullDriver::SSurface>>>,irr::video::CNullDriver::SSurface,__gnu_cxx::__ops::_Iter_less_val>
                      (pSVar1 + left,pSVar1 + right,element);
    iVar2 = ::std::__cxx11::string::compare
                      ((string *)&((_Var3._M_current)->Surface->NamedPath).InternalName);
    if (-1 < iVar2) {
      iVar2 = ::std::__cxx11::string::compare((string *)&(element->Surface->NamedPath).InternalName)
      ;
      if (-1 < iVar2) {
        sVar4 = (s32)((ulong)((long)_Var3._M_current -
                             (long)(this->m_data).
                                   super__Vector_base<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3);
      }
    }
  }
  return sVar4;
}

Assistant:

s32 binary_search(const T &element, s32 left, s32 right) const
	{
		if (left > right)
			return -1;
		auto lpos = std::next(m_data.begin(), left);
		auto rpos = std::next(m_data.begin(), right);
		auto it = std::lower_bound(lpos, rpos, element);
		// *it = first element in [first, last) that is >= element, or last if not found.
		if (*it < element || element < *it)
			return -1;
		return static_cast<u32>(it - m_data.begin());
	}